

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int move_reading_point(archive_read *a,uint64_t offset)

{
  long *plVar1;
  int64_t iVar2;
  long request;
  int iVar3;
  
  plVar1 = (long *)a->format->data;
  iVar3 = 0;
  request = offset - (*plVar1 - plVar1[2]);
  if (request != 0) {
    if (request < 1) {
      iVar3 = 0;
      iVar2 = __archive_read_seek(a,plVar1[2] + offset,0);
      if (iVar2 == -0x19) {
        archive_set_error(&a->archive,-1,"Cannot seek.");
        iVar3 = -0x19;
      }
      else {
        *plVar1 = iVar2;
      }
    }
    else {
      iVar2 = __archive_read_consume(a,request);
      if (iVar2 < 0) {
        iVar3 = (int)iVar2;
      }
      else {
        *plVar1 = *plVar1 + iVar2;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
move_reading_point(struct archive_read *a, uint64_t offset)
{
	struct xar *xar;

	xar = (struct xar *)(a->format->data);
	if (xar->offset - xar->h_base != offset) {
		/* Seek forward to the start of file contents. */
		int64_t step;

		step = offset - (xar->offset - xar->h_base);
		if (step > 0) {
			step = __archive_read_consume(a, step);
			if (step < 0)
				return ((int)step);
			xar->offset += step;
		} else {
			int64_t pos = __archive_read_seek(a, xar->h_base + offset, SEEK_SET);
			if (pos == ARCHIVE_FAILED) {
				archive_set_error(&(a->archive),
				    ARCHIVE_ERRNO_MISC,
				    "Cannot seek.");
				return (ARCHIVE_FAILED);
			}
			xar->offset = pos;
		}
	}
	return (ARCHIVE_OK);
}